

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode
JsSerializeScriptCore
          (byte *script,size_t cb,LoadScriptFlag loadScriptFlag,BYTE *functionTable,
          int functionTableSize,uchar *buffer,uint *bufferSize,JsValueRef scriptSource)

{
  ScriptContext *pSVar1;
  Utf8SourceInfo *this;
  code *pcVar2;
  bool bVar3;
  HRESULT HVar4;
  JsrtContext *pJVar5;
  FunctionProxy *pFVar6;
  FunctionBody *function;
  size_t sVar7;
  TempArenaAllocatorObject *tempAllocator;
  SRCINFO *srcInfo;
  SourceContextInfo *ptr;
  undefined4 *puVar8;
  JsErrorCode JVar9;
  void *unaff_retaddr;
  undefined1 local_140 [8];
  EnterScriptObject __enterScriptObject;
  CompileScriptException se;
  SRCINFO local_b0;
  undefined1 auStack_88 [8];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  uchar *local_48;
  uchar *buffer_local;
  ScriptContext *pSStack_38;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType_1;
  
  se.hasLineNumberInfo = false;
  se._81_7_ = 0;
  __enterScriptObject.library = (JavascriptLibrary *)0x0;
  se.super_ScriptException.ichMin = 0;
  se.super_ScriptException.ichLim = 0;
  se.super_ScriptException.ei.wCode = 0;
  se.super_ScriptException.ei.wReserved = 0;
  se.super_ScriptException.ei._4_4_ = 0;
  se.super_ScriptException.ei.bstrSource = (BSTR)0x0;
  se.super_ScriptException.ei.bstrDescription = (BSTR)0x0;
  se.super_ScriptException.ei.bstrHelpFile = (BSTR)0x0;
  se.super_ScriptException.ei.dwHelpContext = 0;
  se.super_ScriptException.ei._36_4_ = 0;
  se.super_ScriptException.ei.pvReserved = (PVOID)0x0;
  se.super_ScriptException.ei.pfnDeferredFillIn = (_func_HRESULT_tagEXCEPINFO_ptr *)0x0;
  se.super_ScriptException.ei.scode = 0;
  se.super_ScriptException.ei._60_4_ = 0;
  se.line._0_1_ = 0;
  local_48 = buffer;
  pJVar5 = JsrtContext::GetCurrent();
  JVar9 = JsErrorNoCurrentContext;
  if (pJVar5 == (JsrtContext *)0x0) goto LAB_00374b6e;
  pSStack_38 = (((pJVar5->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)auStack_88,
             ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  pSVar1 = pSStack_38;
  JVar9 = JsErrorNullArgument;
  if (bufferSize != (uint *)0x0 && script != (byte *)0x0) {
    if ((ulong)*bufferSize != 0) {
      if (local_48 == (uchar *)0x0) goto LAB_0037485d;
      memset(local_48,0,(ulong)*bufferSize);
    }
    bVar3 = Js::ScriptContext::IsScriptContextInDebugMode(pSVar1);
    if (bVar3) {
      JVar9 = JsErrorCannotSerializeDebugScript;
    }
    else {
      ptr = Js::ScriptContext::GetSourceContextInfo
                      (pSVar1,0xffffffffffffffff,(SimpleDataCacheWrapper *)0x0);
      if (ptr == (SourceContextInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                           ,0xf0b,"(sourceContextInfo != nullptr)","sourceContextInfo != nullptr");
        if (!bVar3) goto LAB_00375073;
        *puVar8 = 0;
      }
      ptr->nextLocalFunctionId = 0;
      Memory::WriteBarrierPtr<SourceContextInfo>::WriteBarrierSet(&local_b0.sourceContextInfo,ptr);
      local_b0.dlnHost = 0;
      local_b0.ulColumnHost = 0;
      local_b0.lnMinHost = 0;
      local_b0.ichMinHost = 0;
      local_b0.ichLimHost =
           (Type)(cb >> ((loadScriptFlag & LoadScriptFlag_Utf8Source) == LoadScriptFlag_None));
      local_b0.ulCharOffset = 0;
      local_b0.moduleID = 0;
      local_b0.grfsi = 0;
      pJVar5 = JsrtContext::GetCurrent();
      bVar3 = ((pJVar5->runtime).ptr)->serializeByteCodeForLibrary;
      se.bstrLine = (BSTR)0x0;
      cb = (size_t)Js::ScriptContext::LoadScript
                             (pSVar1,script,cb,&local_b0,
                              (CompileScriptException *)&__enterScriptObject.library,
                              (Utf8SourceInfo **)&se.bstrLine,L"Global code",
                              (uint)bVar3 + (uint)bVar3 * 2 +
                              (LoadScriptFlag_disableDeferredParse|LoadScriptFlag_Expression) |
                              loadScriptFlag,scriptSource);
      JVar9 = JsNoError;
    }
  }
LAB_0037485d:
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)auStack_88);
  if (JVar9 == JsNoError) {
    pJVar5 = JsrtContext::GetCurrent();
    JVar9 = JsErrorNoCurrentContext;
    if (pJVar5 != (JsrtContext *)0x0) {
      pSVar1 = (((pJVar5->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                ((AutoNestedHandledExceptionType *)((long)&buffer_local + 4),
                 ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
      auStack_88 = (undefined1  [8])0x0;
      ___autoNestedHandledExceptionType = (void *)0x0;
      Js::EnterScriptObject::EnterScriptObject
                ((EnterScriptObject *)local_140,pSVar1,(ScriptEntryExitRecord *)auStack_88,
                 unaff_retaddr,&stack0x00000000,true,true,true);
      Js::ScriptContext::OnScriptStart(pSVar1,true,true);
      Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_140);
      if ((JavascriptFunction *)cb == (JavascriptFunction *)0x0) {
        JVar9 = JsErrorScriptCompile;
        HandleScriptCompileError
                  (pSVar1,(CompileScriptException *)&__enterScriptObject.library,(WCHAR *)0x0);
      }
      else {
        if (DAT_0143bfcb == '\x01') {
          pFVar6 = Js::JavascriptFunction::GetFunctionProxy((JavascriptFunction *)cb);
          if (pFVar6 != (FunctionProxy *)0x0) {
            pFVar6 = Js::JavascriptFunction::GetFunctionProxy((JavascriptFunction *)cb);
            Js::FunctionProxy::EnsureDeserialized(pFVar6);
          }
        }
        function = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)cb);
        this = (function->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
        sVar7 = Js::Utf8SourceInfo::GetCbLength(this,L"JsSerializeScript");
        JVar9 = JsErrorOutOfMemory;
        if (sVar7 >> 0x20 == 0) {
          pSStack_38 = (ScriptContext *)Js::Utf8SourceInfo::GetSource(this,L"JsSerializeScript");
          pJVar5 = JsrtContext::GetCurrent();
          bVar3 = ((pJVar5->runtime).ptr)->serializeByteCodeForLibrary;
          tempAllocator = Js::ScriptContext::GetTemporaryAllocator(pSVar1,L"ByteCodeSerializer");
          srcInfo = Js::FunctionProxy::GetHostSrcInfo((FunctionProxy *)function);
          HVar4 = Js::ByteCodeSerializer::SerializeToBuffer
                            (pSVar1,&tempAllocator->allocator,(DWORD)sVar7,(LPCUTF8)pSStack_38,
                             function,srcInfo,&local_48,bufferSize,(uint)bVar3);
          Js::ScriptContext::ReleaseTemporaryAllocator(pSVar1,tempAllocator);
          JVar9 = HVar4 >> 0x1f & JsErrorScriptCompile;
        }
      }
      Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_140);
      if ((JVar9 & 0x20003) == JsErrorOutOfMemory) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                           ,0xcc,
                           "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                           ,
                           "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                          );
        if (!bVar3) {
LAB_00375073:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar8 = 0;
      }
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
                ((AutoNestedHandledExceptionType *)((long)&buffer_local + 4));
    }
  }
LAB_00374b6e:
  CompileScriptException::~CompileScriptException
            ((CompileScriptException *)&__enterScriptObject.library);
  return JVar9;
}

Assistant:

JsErrorCode JsSerializeScriptCore(const byte *script, size_t cb,
    LoadScriptFlag loadScriptFlag, BYTE *functionTable, int functionTableSize,
    unsigned char *buffer, unsigned int *bufferSize, JsValueRef scriptSource)
{
    Js::JavascriptFunction *function;
    CompileScriptException se;

    JsErrorCode errorCode = ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        PARAM_NOT_NULL(script);
        PARAM_NOT_NULL(bufferSize);

        if (*bufferSize > 0)
        {
            PARAM_NOT_NULL(buffer);
            ZeroMemory(buffer, *bufferSize);
        }

        if (scriptContext->IsScriptContextInDebugMode())
        {
            return JsErrorCannotSerializeDebugScript;
        }

        SourceContextInfo * sourceContextInfo = scriptContext->GetSourceContextInfo(JS_SOURCE_CONTEXT_NONE, nullptr);
        Assert(sourceContextInfo != nullptr);
        sourceContextInfo->nextLocalFunctionId = 0;

        const int chsize = (loadScriptFlag & LoadScriptFlag_Utf8Source) ? sizeof(utf8char_t) : sizeof(WCHAR);
        SRCINFO si = {
            /* sourceContextInfo   */ sourceContextInfo,
            /* dlnHost             */ 0,
            /* ulColumnHost        */ 0,
            /* lnMinHost           */ 0,
            /* ichMinHost          */ 0,
            /* ichLimHost          */ static_cast<ULONG>(cb / chsize), // OK to truncate since this is used to limit sourceText in debugDocument/compilation errors.
            /* ulCharOffset        */ 0,
            /* mod                 */ kmodGlobal,
            /* grfsi               */ 0
        };
        bool isSerializeByteCodeForLibrary = false;
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        isSerializeByteCodeForLibrary = JsrtContext::GetCurrent()->GetRuntime()->IsSerializeByteCodeForLibrary();
#endif

        Js::Utf8SourceInfo* sourceInfo = nullptr;
        loadScriptFlag = (LoadScriptFlag)(loadScriptFlag | LoadScriptFlag_disableDeferredParse);
        if (isSerializeByteCodeForLibrary)
        {
            loadScriptFlag = (LoadScriptFlag)(loadScriptFlag | LoadScriptFlag_isByteCodeBufferForLibrary);
        }
        else
        {
            loadScriptFlag = (LoadScriptFlag)(loadScriptFlag | LoadScriptFlag_Expression);
        }
        function = scriptContext->LoadScript(script, cb, &si, &se, &sourceInfo,
            Js::Constants::GlobalCode, loadScriptFlag, scriptSource);
        return JsNoError;
    });

    if (errorCode != JsNoError)
    {
        return errorCode;
    }

    return ContextAPIWrapper_NoRecord<false>([&](Js::ScriptContext* scriptContext) -> JsErrorCode {
        if (function == nullptr)
        {
            HandleScriptCompileError(scriptContext, &se);
            return JsErrorScriptCompile;
        }
        // Could we have a deserialized function in this case?
        // If we are going to serialize it, a check isn't to expensive
        if (CONFIG_FLAG(ForceSerialized) && function->GetFunctionProxy() != nullptr) {
            function->GetFunctionProxy()->EnsureDeserialized();
        }
        Js::FunctionBody *functionBody = function->GetFunctionBody();
        const Js::Utf8SourceInfo *sourceInfo = functionBody->GetUtf8SourceInfo();
        size_t cSourceCodeLength = sourceInfo->GetCbLength(_u("JsSerializeScript"));

        // truncation of code length can lead to accessing random memory. Reject the call.
        if (cSourceCodeLength > DWORD_MAX)
        {
            return JsErrorOutOfMemory;
        }

        LPCUTF8 utf8Code = sourceInfo->GetSource(_u("JsSerializeScript"));
        DWORD dwFlags = 0;
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        dwFlags = JsrtContext::GetCurrent()->GetRuntime()->IsSerializeByteCodeForLibrary() ? GENERATE_BYTE_CODE_BUFFER_LIBRARY : 0;
#endif

        BEGIN_TEMP_ALLOCATOR(tempAllocator, scriptContext, _u("ByteCodeSerializer"));
        // We cast buffer size to DWORD* because on Windows, DWORD = unsigned long = unsigned int
        // On 64-bit clang on linux, this is not true, unsigned long is larger than unsigned int
        // However, the PAL defines DWORD for us on linux as unsigned int so the cast is safe here.
        HRESULT hr = Js::ByteCodeSerializer::SerializeToBuffer(scriptContext,
            tempAllocator, static_cast<DWORD>(cSourceCodeLength), utf8Code,
            functionBody, functionBody->GetHostSrcInfo(), &buffer,
            (DWORD*) bufferSize, dwFlags);
        END_TEMP_ALLOCATOR(tempAllocator, scriptContext);

        if (SUCCEEDED(hr))
        {
            return JsNoError;
        }
        else
        {
            return JsErrorScriptCompile;
        }
    });
}